

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O0

int svc_xprt_fd_cmpf(opr_rbtree_node *lhs,opr_rbtree_node *rhs)

{
  rpc_dplx_rec *rk;
  rpc_dplx_rec *lk;
  opr_rbtree_node *rhs_local;
  opr_rbtree_node *lhs_local;
  
  if (*(int *)&lhs[-0xd].parent < *(int *)&rhs[-0xd].parent) {
    lhs_local._4_4_ = -1;
  }
  else if (*(int *)&lhs[-0xd].parent == *(int *)&rhs[-0xd].parent) {
    lhs_local._4_4_ = 0;
  }
  else {
    lhs_local._4_4_ = 1;
  }
  return lhs_local._4_4_;
}

Assistant:

static inline int
svc_xprt_fd_cmpf(const struct opr_rbtree_node *lhs,
		 const struct opr_rbtree_node *rhs)
{
	struct rpc_dplx_rec *lk, *rk;

	lk = opr_containerof(lhs, struct rpc_dplx_rec, fd_node);
	rk = opr_containerof(rhs, struct rpc_dplx_rec, fd_node);

	if (lk->xprt.xp_fd < rk->xprt.xp_fd)
		return (-1);

	if (lk->xprt.xp_fd == rk->xprt.xp_fd)
		return (0);

	return (1);
}